

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alphabet.c
# Opt level: O3

short * vrna_seq_encode(char *sequence,vrna_md_t *md)

{
  int iVar1;
  short *psVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (md == (vrna_md_t *)0x0 || sequence == (char *)0x0) {
    psVar2 = (short *)0x0;
  }
  else {
    psVar2 = vrna_seq_encode_simple(sequence,md);
    sVar3 = strlen(sequence);
    iVar1 = (int)sVar3;
    if (iVar1 != 0) {
      uVar4 = 2;
      if (2 < iVar1 + 1U) {
        uVar4 = (ulong)(iVar1 + 1U);
      }
      uVar5 = 1;
      do {
        psVar2[uVar5] = md->alias[psVar2[uVar5]];
        uVar5 = uVar5 + 1;
      } while (uVar4 != uVar5);
    }
    psVar2[iVar1 + 1] = psVar2[1];
    *psVar2 = psVar2[sVar3 & 0xffffffff];
  }
  return psVar2;
}

Assistant:

PUBLIC short *
vrna_seq_encode(const char  *sequence,
                vrna_md_t   *md)
{
  unsigned int  i, l;
  short         *S = NULL;

  if (sequence && md) {
    S = vrna_seq_encode_simple(sequence, md);

    l = (unsigned int)strlen(sequence);

    for (i = 1; i <= l; i++)
      S[i] = md->alias[S[i]];

    S[l + 1]  = S[1];
    S[0]      = S[l];
  }

  return S;
}